

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_malloc.c
# Opt level: O2

void * ga_malloc(Integer nelem,int type,char *name)

{
  Integer IVar1;
  long nelem_00;
  Boolean BVar2;
  Integer *pIVar3;
  ulong uVar4;
  Integer handle;
  Integer *local_30;
  
  pIVar3 = &handle;
  IVar1 = pnga_type_f2c((long)type);
  uVar4 = *(ulong *)(BYTE_ARRAY_001d0311 + IVar1 * 0x10 + 0x67);
  if (0x10U % uVar4 != 0) {
    pnga_error("ga_malloc: GA datatype cannot be aligned.Adjust ALIGNMENT",0);
  }
  nelem_00 = 0x20 / uVar4 + nelem;
  if (ga_usesMA == 0) {
    pIVar3 = (Integer *)(*ga_ext_alloc)(nelem_00 * uVar4,(int)uVar4,name);
  }
  else {
    BVar2 = MA_push_stack((long)type,nelem_00,name,&handle);
    if (BVar2 == 0) {
      pnga_error("ga_malloc: MA_push_stack failed",0);
    }
    else {
      MA_get_pointer(handle,&local_30);
      pIVar3 = local_30;
    }
  }
  uVar4 = (ulong)((uint)pIVar3 & 0xf);
  local_30 = (Integer *)((0x10 - uVar4) + (long)pIVar3);
  if (uVar4 == 0) {
    local_30 = pIVar3;
  }
  if ((ga_usesMA == 0) && (handle = 0x10 - uVar4, uVar4 == 0)) {
    handle = 0;
  }
  if (local_30 == (Integer *)0x0) {
    pnga_error("ga_malloc failed",0);
  }
  *local_30 = handle;
  return local_30 + 2;
}

Assistant:

void* ga_malloc(Integer nelem, int type, char *name)
{
    void *ptr;  
    size_t addr;
    Integer handle, adjust=0, bytes, item_size=GAsizeofM(pnga_type_f2c(type));
    Integer extra;

#if NOFORT
    type = pnga_type_f2c(type);
#endif

    /* extra space for 1.ALIGNMENT and 2.storing handle */
    if(ALIGNMENT%item_size)
       pnga_error("ga_malloc: GA datatype cannot be aligned.Adjust ALIGNMENT",0);
    extra = 2*ALIGNMENT/item_size;
    nelem += extra;

    if(ga_usesMA) { /* Uses Memory Allocator (MA) */
       if(MA_push_stack(type,nelem,name,&handle))  MA_get_pointer(handle,&ptr);
       else pnga_error("ga_malloc: MA_push_stack failed",0);
       addr = (size_t)ptr;
    }
    else { /* else, using external memory allocator */
       bytes = nelem*item_size;
       addr  = (size_t)(*ga_ext_alloc)(
               (size_t)bytes, (int)item_size, name);
    }

    /* Address Alignment */
    adjust = (Integer) (addr%ALIGNMENT);
    if(adjust != 0) { adjust=ALIGNMENT-adjust; addr+=adjust; }
    ptr = (void *)addr; 
    if(!ga_usesMA) handle = adjust;

    if(ptr == NULL) pnga_error("ga_malloc failed", 0L);
    *((Integer*)ptr)=handle;/*store handle or adjustment-value in this buffer*/
    ptr = ((char*)ptr) + ALIGNMENT;

    return ptr;
}